

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowOuterBorders(ImGuiWindow *window)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  int border_n;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  ImVec2 local_ac;
  ImVec2 local_a4;
  float local_9c;
  ImVec2 IStack_98;
  float y;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect border_r;
  ImGuiResizeBorderDef *def;
  ImVec2 IStack_28;
  int border_held;
  float local_20;
  float local_1c;
  float border_size;
  float rounding;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  _border_size = GImGui;
  local_1c = window->WindowRounding;
  local_20 = window->WindowBorderSize;
  g = (ImGuiContext *)window;
  if ((0.0 < local_20) && ((window->Flags & 0x80U) == 0)) {
    pIVar1 = window->DrawList;
    IStack_28 = ::operator+(&window->Pos,&window->Size);
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&window->Pos,&stack0xffffffffffffffd8,IVar2,local_1c,0,local_20);
  }
  border_n = (int)*(char *)&(g->IO).KeyRepeatRate;
  if (border_n != -1) {
    border_r.Max = (ImVec2)(resize_border_def + border_n);
    IVar5 = GetResizeBorderRect((ImGuiWindow *)g,border_n,local_1c,0.0);
    border_r.Min = IVar5.Max;
    local_48 = IVar5.Min;
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x16c);
    local_60 = ImLerp(&local_48,&border_r.Min,(ImVec2 *)((long)border_r.Max + 8));
    ImVec2::ImVec2(&local_68,0.5,0.5);
    local_58 = ::operator+(&local_60,&local_68);
    local_70 = ::operator*((ImVec2 *)border_r.Max,local_1c);
    local_50 = ::operator+(&local_58,&local_70);
    ImDrawList::PathArcTo
              (pIVar1,&local_50,local_1c,*(float *)((long)border_r.Max + 0x18) + -0.7853982,
               *(float *)((long)border_r.Max + 0x18),0);
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x16c);
    local_88 = ImLerp(&local_48,&border_r.Min,(ImVec2 *)((long)border_r.Max + 0x10));
    ImVec2::ImVec2(&local_90,0.5,0.5);
    local_80 = ::operator+(&local_88,&local_90);
    IStack_98 = ::operator*((ImVec2 *)border_r.Max,local_1c);
    local_78 = ::operator+(&local_80,&stack0xffffffffffffff68);
    ImDrawList::PathArcTo
              (pIVar1,&local_78,local_1c,*(float *)((long)border_r.Max + 0x18),
               *(float *)((long)border_r.Max + 0x18) + 0.7853982,0);
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x16c);
    IVar2 = GetColorU32(0x1d,1.0);
    fVar3 = ImMax<float>(2.0,local_20);
    ImDrawList::PathStroke(pIVar1,IVar2,0,fVar3);
  }
  if ((0.0 < (_border_size->Style).FrameBorderSize) && (((g->IO).BackendFlags & 1U) == 0)) {
    fVar3 = (g->IO).DisplaySize.y;
    fVar4 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)g);
    local_9c = (fVar3 + fVar4) - 1.0;
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x16c);
    ImVec2::ImVec2(&local_a4,(g->IO).DisplaySize.x + local_20,local_9c);
    ImVec2::ImVec2(&local_ac,((g->IO).DisplaySize.x + (g->IO).DeltaTime) - local_20,local_9c);
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddLine(pIVar1,&local_a4,&local_ac,IVar2,(_border_size->Style).FrameBorderSize);
  }
  return;
}

Assistant:

static void ImGui::RenderWindowOuterBorders(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    float rounding = window->WindowRounding;
    float border_size = window->WindowBorderSize;
    if (border_size > 0.0f && !(window->Flags & ImGuiWindowFlags_NoBackground))
        window->DrawList->AddRect(window->Pos, window->Pos + window->Size, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);

    int border_held = window->ResizeBorderHeld;
    if (border_held != -1)
    {
        const ImGuiResizeBorderDef& def = resize_border_def[border_held];
        ImRect border_r = GetResizeBorderRect(window, border_held, rounding, 0.0f);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN1) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle - IM_PI * 0.25f, def.OuterAngle);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN2) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle, def.OuterAngle + IM_PI * 0.25f);
        window->DrawList->PathStroke(GetColorU32(ImGuiCol_SeparatorActive), 0, ImMax(2.0f, border_size)); // Thicker than usual
    }
    if (g.Style.FrameBorderSize > 0 && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
    {
        float y = window->Pos.y + window->TitleBarHeight() - 1;
        window->DrawList->AddLine(ImVec2(window->Pos.x + border_size, y), ImVec2(window->Pos.x + window->Size.x - border_size, y), GetColorU32(ImGuiCol_Border), g.Style.FrameBorderSize);
    }
}